

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNESTMeanYieldsBenchmarks.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  VDetector *detector;
  RandomGen *this;
  ostream *poVar2;
  uint64_t s;
  ulong uVar3;
  double *pdVar4;
  LArNESTResult *pLVar5;
  size_t i;
  long lVar6;
  size_t v;
  ulong uVar7;
  size_t i_1;
  byte bVar8;
  initializer_list<NEST::LArInteraction> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  vector<double,_std::allocator<double>_> electric_field;
  double local_8e0;
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> particle_types;
  vector<double,_std::allocator<double>_> energy_vals;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  particle_type;
  LArNESTResult result;
  LArNESTResult local_808;
  ofstream output_file;
  LArNEST larnest;
  
  bVar8 = 0;
  if (argc < 2) {
    local_8e0 = 1.393;
  }
  else {
    local_8e0 = atof(argv[1]);
    if (argc != 2) {
      iVar1 = atoi(argv[2]);
      s = (uint64_t)iVar1;
      goto LAB_001039b9;
    }
  }
  s = 0;
LAB_001039b9:
  energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar6 = 0; lVar6 != 50000; lVar6 = lVar6 + 1) {
    larnest.super_NESTcalc._vptr_NESTcalc = (_func_int **)((double)lVar6 * 0.019998 + 0.1);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&energy_vals,(double *)&larnest);
  }
  larnest.super_NESTcalc._vptr_NESTcalc = (_func_int **)0x100000000;
  larnest.super_NESTcalc.fdetector._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&larnest;
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::vector
            (&particle_types,__l,(allocator_type *)&output_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&larnest,"NR",(allocator<char> *)&output_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&larnest.super_NESTcalc.field_0x20,"ER",(allocator<char> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&larnest.super_NESTcalc.field_0x40,"Alpha",(allocator<char> *)&local_808);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&larnest;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&particle_type,__l_00,(allocator_type *)&electric_field);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&larnest.super_NESTcalc._vptr_NESTcalc + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  detector = (VDetector *)operator_new(0x128);
  LArDetector::LArDetector((LArDetector *)detector);
  NEST::LArNEST::LArNEST(&larnest,detector);
  this = RandomGen::rndm();
  RandomGen::SetSeed(this,s);
  result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ofstream::ofstream(&output_file);
  std::ofstream::open((char *)&output_file,0x115254);
  std::operator<<((ostream *)&output_file,
                  "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_std,Ne_std,Nex_std,Nion_std\n"
                 );
  uVar3 = 0;
  while( true ) {
    __l_01._M_array = &local_808;
    if ((ulong)((long)particle_types.
                      super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)particle_types.
                      super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar3) break;
    electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (particle_types.
        super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] == ER) {
      pdVar4 = (double *)&DAT_00115198;
      pLVar5 = __l_01._M_array;
      for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pLVar5->yields).TotalYield = *pdVar4;
        pdVar4 = pdVar4 + (ulong)bVar8 * -2 + 1;
        pLVar5 = (LArNESTResult *)((long)pLVar5 + ((ulong)bVar8 * -2 + 1) * 8);
      }
      __l_02._M_len = 10;
      __l_02._M_array = (iterator)__l_01._M_array;
      std::vector<double,_std::allocator<double>_>::insert
                (&electric_field,(const_iterator)0x0,__l_02);
    }
    else if (particle_types.
             super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>._M_impl
             .super__Vector_impl_data._M_start[uVar3] == NR) {
      pdVar4 = (double *)&DAT_00115148;
      pLVar5 = __l_01._M_array;
      for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pLVar5->yields).TotalYield = *pdVar4;
        pdVar4 = pdVar4 + (ulong)bVar8 * -2 + 1;
        pLVar5 = (LArNESTResult *)((long)pLVar5 + ((ulong)bVar8 * -2 + 1) * 8);
      }
      __l_01._M_len = 10;
      std::vector<double,_std::allocator<double>_>::insert
                (&electric_field,(const_iterator)0x0,__l_01);
    }
    else {
      local_808.yields.Nion = 10000.0;
      local_808.yields.Lindhard = 20000.0;
      local_808.yields.Ne = 1000.0;
      local_808.yields.Nex = 5000.0;
      local_808.yields.LightYield = 100.0;
      local_808.yields.Nph = 500.0;
      local_808.yields.TotalYield = 1.0;
      local_808.yields.QuantaYield = 50.0;
      __l_03._M_len = 8;
      __l_03._M_array = (iterator)__l_01._M_array;
      std::vector<double,_std::allocator<double>_>::insert
                (&electric_field,(const_iterator)0x0,__l_03);
    }
    for (uVar7 = 0;
        uVar7 < (ulong)((long)electric_field.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)electric_field.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
      for (lVar6 = 0; lVar6 != 50000; lVar6 = lVar6 + 1) {
        NEST::LArNEST::FullCalculation
                  (&local_808,&larnest,
                   particle_types.
                   super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar3],
                   energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6],0.0,
                   electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],local_8e0,false);
        NEST::LArNESTResult::operator=(&result,&local_808);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&local_808.photon_times.super__Vector_base<double,_std::allocator<double>_>);
        poVar2 = std::operator<<((ostream *)&output_file,
                                 (string *)
                                 (particle_type.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar3));
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar6]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (electric_field.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar7]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(result.yields.TotalYield);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(result.yields.QuantaYield);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(result.yields.LightYield);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(result.yields.Nph);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(result.yields.Ne);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(result.yields.Nex);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(result.yields.Nion);
        std::operator<<(poVar2,",0,0,0,0,0,0,0\n");
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&electric_field.super__Vector_base<double,_std::allocator<double>_>);
    uVar3 = uVar3 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&output_file);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&result.photon_times.super__Vector_base<double,_std::allocator<double>_>);
  NEST::LArNEST::~LArNEST(&larnest);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&particle_type);
  std::_Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::~_Vector_base
            (&particle_types.
              super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&energy_vals.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  // this sample program takes can take two arguments,
  // (optional) 1) density - the density of the LAr to use
  // (optional) 2) seed - a seed for the random number generator

  double density = 1.393;
  uint64_t seed = 0;
  if (argc > 1) {
    density = atof(argv[1]);
  }
  if (argc > 2) {
    seed = atoi(argv[2]);
  }

  // set up energy steps
  int num_energy_steps = 50000;
  std::vector<double> energy_vals;
  double start_val = .1;
  double end_val = 1000;
  double step_size = (end_val - start_val) / num_energy_steps;

  for (size_t i = 0; i < num_energy_steps; i++) {
    energy_vals.emplace_back(start_val + step_size * i);
  }
  std::vector<NEST::LArInteraction> particle_types = {
      NEST::LArInteraction::NR, NEST::LArInteraction::ER,
      NEST::LArInteraction::Alpha};
  std::vector<std::string> particle_type = {"NR", "ER", "Alpha"};

  LArDetector* detector = new LArDetector();
  // Construct NEST class using detector object
  NEST::LArNEST larnest(detector);
  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(seed);

  // Construct NEST objects for storing calculation results
  NEST::LArNESTResult result;
  std::ofstream output_file;

  output_file.open("mean_yields_benchmarks.csv");
  output_file << "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,"
                 "Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_"
                 "std,Ne_std,Nex_std,Nion_std\n";

  // iterate over electric field values
  for (size_t k = 0; k < particle_types.size(); k++) {
    std::vector<double> electric_field;
    if (particle_types[k] == NEST::LArInteraction::NR) {
      electric_field.insert(electric_field.end(), {1, 50, 100, 200, 250, 500,
                                                   1000, 1500, 1750, 2000});
    } else if (particle_types[k] == NEST::LArInteraction::ER) {
      electric_field.insert(electric_field.end(), {1, 100, 200, 600, 1000, 1500,
                                                   2500, 6000, 9000, 9500});
    } else {
      electric_field.insert(electric_field.end(),
                            {1, 50, 100, 500, 1000, 5000, 10000, 20000});
    }
    for (size_t v = 0; v < electric_field.size(); v++) {
      // iterate over energy values
      for (size_t i = 0; i < num_energy_steps; i++) {
        result = larnest.FullCalculation(particle_types[k], energy_vals[i], 0,
                                         electric_field[v], density, false);
        output_file << particle_type[k] << ",";
        output_file << energy_vals[i] << ",";
        output_file << electric_field[v] << ",";
        output_file << result.yields.TotalYield << ",";
        output_file << result.yields.QuantaYield << ",";
        output_file << result.yields.LightYield << ",";
        output_file << result.yields.Nph << ",";
        output_file << result.yields.Ne << ",";
        output_file << result.yields.Nex << ",";
        output_file << result.yields.Nion << ",0,0,0,0,0,0,0\n";
      }
    }
  }
  output_file.close();
  return 0;
}